

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaUnit.cpp
# Opt level: O2

string * __thiscall
Kernel::FormulaUnit::toString_abi_cxx11_(string *__return_storage_ptr__,FormulaUnit *this)

{
  uint in_EDX;
  string sStack_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Lib::Int::toString_abi_cxx11_(&local_38,(Int *)(ulong)(this->super_Unit)._number,in_EDX);
  std::operator+(&local_98,&local_38,". ");
  Formula::toString_abi_cxx11_(&local_b8,this->_formula);
  std::operator+(&local_78,&local_98,&local_b8);
  std::operator+(&local_58,&local_78,' ');
  Unit::inferenceAsString_abi_cxx11_(&sStack_d8,&this->super_Unit);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_d8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string FormulaUnit::toString() const
{
  return Int::toString(_number) + ". " + _formula->toString() +
         ' ' + inferenceAsString();
}